

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildSimdConversion
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot srcRegSlot,IRType dstSimdType,IRType srcSimdType)

{
  ValueType valueType;
  ValueType valueType_00;
  OpCode opcode;
  RegOpnd *this_00;
  RegOpnd *this_01;
  Instr *instr;
  IRBuilderAsmJs *this_02;
  
  this_02 = this;
  valueType = GetSimdValueTypeFromIRType(this,srcSimdType);
  valueType_00 = GetSimdValueTypeFromIRType(this_02,dstSimdType);
  this_00 = BuildSrcOpnd(this,srcRegSlot,srcSimdType);
  IR::Opnd::SetValueType(&this_00->super_Opnd,valueType);
  this_01 = BuildDstOpnd(this,dstRegSlot,dstSimdType);
  IR::Opnd::SetValueType(&this_01->super_Opnd,valueType_00);
  opcode = GetSimdOpcode(this,newOpcode);
  instr = IR::Instr::New(opcode,&this_01->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildSimdConversion(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot srcRegSlot, IRType dstSimdType, IRType srcSimdType)
{
    ValueType srcValueType = GetSimdValueTypeFromIRType(srcSimdType);
    ValueType dstValueType = GetSimdValueTypeFromIRType(dstSimdType);

    IR::RegOpnd * src1Opnd = BuildSrcOpnd(srcRegSlot, srcSimdType);
    src1Opnd->SetValueType(srcValueType);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, dstSimdType);
    dstOpnd->SetValueType(dstValueType);

    Js::OpCode opcode = GetSimdOpcode(newOpcode);
    IR::Instr * instr = IR::Instr::New(opcode, dstOpnd, src1Opnd, m_func);
    AddInstr(instr, offset);
}